

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O0

void StoreSimpleHuffmanTree
               (uint8_t *depths,size_t *symbols,size_t num_symbols,size_t max_bits,
               size_t *storage_ix,uint8_t *storage)

{
  size_t sVar1;
  size_t __brotli_swap_tmp;
  size_t j;
  size_t i;
  uint8_t *storage_local;
  size_t *storage_ix_local;
  size_t max_bits_local;
  size_t num_symbols_local;
  size_t *symbols_local;
  uint8_t *depths_local;
  uint64_t v_11;
  uint8_t *p_11;
  uint64_t v_10;
  uint8_t *p_10;
  uint64_t v_9;
  uint8_t *p_9;
  uint64_t v_8;
  uint8_t *p_8;
  uint64_t v_7;
  uint8_t *p_7;
  uint64_t v_6;
  uint8_t *p_6;
  uint64_t v_5;
  uint8_t *p_5;
  uint64_t v_4;
  uint8_t *p_4;
  uint64_t v_3;
  uint8_t *p_3;
  uint64_t v_2;
  uint8_t *p_2;
  uint64_t v_1;
  uint8_t *p_1;
  uint64_t v;
  uint8_t *p;
  
  *(ulong *)(storage + (*storage_ix >> 3)) =
       1L << ((byte)*storage_ix & 7) | (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
  *storage_ix = *storage_ix + 2;
  *(size_t *)(storage + (*storage_ix >> 3)) =
       num_symbols - 1 << ((byte)*storage_ix & 7) |
       (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
  *storage_ix = *storage_ix + 2;
  for (j = 0; __brotli_swap_tmp = j, j < num_symbols; j = j + 1) {
    while (__brotli_swap_tmp = __brotli_swap_tmp + 1, __brotli_swap_tmp < num_symbols) {
      if (depths[symbols[__brotli_swap_tmp]] < depths[symbols[j]]) {
        sVar1 = symbols[__brotli_swap_tmp];
        symbols[__brotli_swap_tmp] = symbols[j];
        symbols[j] = sVar1;
      }
    }
  }
  if (num_symbols == 2) {
    *(size_t *)(storage + (*storage_ix >> 3)) =
         *symbols << ((byte)*storage_ix & 7) | (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3))
    ;
    *storage_ix = max_bits + *storage_ix;
    *(size_t *)(storage + (*storage_ix >> 3)) =
         symbols[1] << ((byte)*storage_ix & 7) |
         (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = max_bits + *storage_ix;
  }
  else if (num_symbols == 3) {
    *(size_t *)(storage + (*storage_ix >> 3)) =
         *symbols << ((byte)*storage_ix & 7) | (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3))
    ;
    *storage_ix = max_bits + *storage_ix;
    *(size_t *)(storage + (*storage_ix >> 3)) =
         symbols[1] << ((byte)*storage_ix & 7) |
         (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = max_bits + *storage_ix;
    *(size_t *)(storage + (*storage_ix >> 3)) =
         symbols[2] << ((byte)*storage_ix & 7) |
         (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = max_bits + *storage_ix;
  }
  else {
    *(size_t *)(storage + (*storage_ix >> 3)) =
         *symbols << ((byte)*storage_ix & 7) | (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3))
    ;
    *storage_ix = max_bits + *storage_ix;
    *(size_t *)(storage + (*storage_ix >> 3)) =
         symbols[1] << ((byte)*storage_ix & 7) |
         (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = max_bits + *storage_ix;
    *(size_t *)(storage + (*storage_ix >> 3)) =
         symbols[2] << ((byte)*storage_ix & 7) |
         (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = max_bits + *storage_ix;
    *(size_t *)(storage + (*storage_ix >> 3)) =
         symbols[3] << ((byte)*storage_ix & 7) |
         (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = max_bits + *storage_ix;
    *(ulong *)(storage + (*storage_ix >> 3)) =
         (long)(int)(uint)(depths[*symbols] == '\x01') << ((byte)*storage_ix & 7) |
         (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = *storage_ix + 1;
  }
  return;
}

Assistant:

static void StoreSimpleHuffmanTree(const uint8_t* depths,
                                   size_t symbols[4],
                                   size_t num_symbols,
                                   size_t max_bits,
                                   size_t* storage_ix, uint8_t* storage) {
  /* value of 1 indicates a simple Huffman code */
  BrotliWriteBits(2, 1, storage_ix, storage);
  BrotliWriteBits(2, num_symbols - 1, storage_ix, storage);  /* NSYM - 1 */

  {
    /* Sort */
    size_t i;
    for (i = 0; i < num_symbols; i++) {
      size_t j;
      for (j = i + 1; j < num_symbols; j++) {
        if (depths[symbols[j]] < depths[symbols[i]]) {
          BROTLI_SWAP(size_t, symbols, j, i);
        }
      }
    }
  }

  if (num_symbols == 2) {
    BrotliWriteBits(max_bits, symbols[0], storage_ix, storage);
    BrotliWriteBits(max_bits, symbols[1], storage_ix, storage);
  } else if (num_symbols == 3) {
    BrotliWriteBits(max_bits, symbols[0], storage_ix, storage);
    BrotliWriteBits(max_bits, symbols[1], storage_ix, storage);
    BrotliWriteBits(max_bits, symbols[2], storage_ix, storage);
  } else {
    BrotliWriteBits(max_bits, symbols[0], storage_ix, storage);
    BrotliWriteBits(max_bits, symbols[1], storage_ix, storage);
    BrotliWriteBits(max_bits, symbols[2], storage_ix, storage);
    BrotliWriteBits(max_bits, symbols[3], storage_ix, storage);
    /* tree-select */
    BrotliWriteBits(1, depths[symbols[0]] == 1 ? 1 : 0, storage_ix, storage);
  }
}